

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

pair<double,_double> __thiscall HPresolve::getImpliedRowBounds(HPresolve *this,int row)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  pair<double,_double> pVar24;
  
  uVar15 = (ulong)row;
  piVar2 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = (long)(this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
  uVar19 = uVar15;
  if ((uVar11 <= uVar15) || (uVar19 = (ulong)(row + 1), uVar11 <= uVar19)) {
LAB_001430a4:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar19,
               uVar11);
  }
  iVar1 = piVar2[uVar15];
  uVar16 = (ulong)iVar1;
  piVar3 = (this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = (long)(this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
  piVar4 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = (long)(this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>._M_impl
                .super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
  pdVar5 = (this->super_HPreData).ARvalue.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)(this->super_HPreData).ARvalue.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pdVar5 >> 3;
  pdVar6 = (this->super_HPreData).colLower.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar17 = (long)(this->super_HPreData).colLower.super__Vector_base<double,_std::allocator<double>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar6 >> 3;
  pdVar7 = (this->super_HPreData).colUpper.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar18 = (long)(this->super_HPreData).colUpper.super__Vector_base<double,_std::allocator<double>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar7 >> 3;
  uVar15 = uVar16;
  if (uVar16 < uVar12) {
    uVar15 = uVar12;
  }
  iVar14 = piVar2[uVar19];
  dVar22 = 0.0;
  dVar21 = 0.0;
  iVar8 = iVar14;
  if (iVar14 < iVar1) {
    iVar8 = iVar1;
  }
  if (iVar1 < iVar14) {
    uVar20 = uVar16;
    do {
      uVar11 = uVar12;
      uVar19 = uVar15;
      if ((uVar12 <= uVar20) ||
         (uVar13 = (ulong)piVar3[uVar20], uVar11 = uVar9, uVar19 = uVar13, uVar9 <= uVar13))
      goto LAB_001430a4;
      if (piVar4[uVar13] != 0) {
        uVar11 = uVar10;
        uVar19 = uVar20;
        if (uVar10 <= uVar20) goto LAB_001430a4;
        if (0.0 <= pdVar5[uVar20]) {
          uVar11 = uVar17;
          uVar19 = uVar13;
          if (uVar17 <= uVar13) goto LAB_001430a4;
          dVar23 = pdVar6[uVar13];
          if (-1e+200 < dVar23) goto LAB_00142f79;
        }
        else {
          uVar11 = uVar18;
          uVar19 = uVar13;
          if (uVar18 <= uVar13) goto LAB_001430a4;
          dVar23 = pdVar7[uVar13];
          if (dVar23 < 1e+200) {
LAB_00142f79:
            dVar21 = dVar21 + pdVar5[uVar20] * dVar23;
            goto LAB_00142f81;
          }
        }
        dVar21 = -1e+200;
        break;
      }
LAB_00142f81:
      uVar20 = uVar20 + 1;
    } while ((long)iVar8 != uVar20);
  }
  if (iVar1 < iVar14) {
    iVar14 = iVar14 - iVar1;
    dVar22 = 0.0;
    do {
      uVar11 = uVar12;
      uVar19 = uVar15;
      if ((uVar12 <= uVar16) ||
         (uVar20 = (ulong)piVar3[uVar16], uVar11 = uVar9, uVar19 = uVar20, uVar9 <= uVar20))
      goto LAB_001430a4;
      if (piVar4[uVar20] != 0) {
        uVar11 = uVar10;
        uVar19 = uVar16;
        if (uVar10 <= uVar16) goto LAB_001430a4;
        if (0.0 <= pdVar5[uVar16]) {
          uVar11 = uVar18;
          uVar19 = uVar20;
          if (uVar18 <= uVar20) goto LAB_001430a4;
          dVar23 = pdVar7[uVar20];
          if (dVar23 < 1e+200) goto LAB_0014300c;
        }
        else {
          uVar11 = uVar17;
          uVar19 = uVar20;
          if (uVar17 <= uVar20) goto LAB_001430a4;
          dVar23 = pdVar6[uVar20];
          if (-1e+200 < dVar23) {
LAB_0014300c:
            dVar22 = dVar22 + pdVar5[uVar16] * dVar23;
            goto LAB_00143014;
          }
        }
        dVar22 = 1e+200;
        break;
      }
LAB_00143014:
      uVar16 = uVar16 + 1;
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
  }
  pVar24.second = dVar22;
  pVar24.first = dVar21;
  return pVar24;
}

Assistant:

pair<double, double> HPresolve::getImpliedRowBounds(int row) {
	double g=0;
	double h=0;

	int col;
	for (int k = ARstart.at(row); k<ARstart.at(row+1); ++k) {
		col = ARindex.at(k);
		if (flagCol.at(col)) {
			if (ARvalue.at(k) < 0) {
				if (colUpper.at(col) < HSOL_CONST_INF)
					g+= ARvalue.at(k)*colUpper.at(col);
				else {
					g = -HSOL_CONST_INF;
					break;
				}
			}
			else {
				if (colLower.at(col) > -HSOL_CONST_INF)
					g+= ARvalue.at(k)*colLower.at(col);
				else {
					g = -HSOL_CONST_INF;
					break;
				}
			}
		}
	}

	for (int k = ARstart.at(row); k<ARstart.at(row+1); ++k) {
		col = ARindex.at(k);
		if (flagCol.at(col)) {
			if (ARvalue.at(k) < 0) {
				if (colLower.at(col) > -HSOL_CONST_INF)
					h+= ARvalue.at(k)*colLower.at(col);
				else {
					h = HSOL_CONST_INF;
					break;
				}

			}
			else {
				if (colUpper.at(col) < HSOL_CONST_INF)
					h+= ARvalue.at(k)*colUpper.at(col);
				else {
					h = HSOL_CONST_INF;
					break;
				}
			}
		}
	}
	return make_pair(g, h);
}